

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.cpp
# Opt level: O2

actor_ref * __thiscall acto::actor_ref::operator=(actor_ref *this,actor_ref *rhs)

{
  runtime_t *this_00;
  object_t *poVar1;
  
  if (this != rhs) {
    poVar1 = rhs->object_;
    if (this->object_ != poVar1 && this->object_ != (object_t *)0x0) {
      this_00 = core::runtime_t::instance();
      core::runtime_t::release(this_00,this->object_);
      poVar1 = rhs->object_;
    }
    this->object_ = poVar1;
    rhs->object_ = (object_t *)0x0;
  }
  return this;
}

Assistant:

actor_ref& actor_ref::operator=(actor_ref&& rhs) {
  if (this != &rhs) {
    if (object_ && object_ != rhs.object_) {
      core::runtime_t::instance()->release(object_);
    }
    object_ = rhs.object_;
    rhs.object_ = nullptr;
  }
  return *this;
}